

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_prepare.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalPrepare *op)

{
  shared_ptr<duckdb::PreparedStatementData,_true> *this_00;
  undefined1 auVar1 [8];
  PreparedStatementData *pPVar2;
  reference this_01;
  pointer pPVar3;
  PhysicalOperator *pPVar4;
  PhysicalPlanGenerator inner_planner;
  undefined1 local_120 [8];
  PhysicalPlanGenerator local_118;
  
  this_00 = &op->prepared;
  pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(this_00);
  if (((pPVar2->properties).bound_all_parameters == true) &&
     ((op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    PhysicalPlanGenerator((PhysicalPlanGenerator *)(local_120 + 8),this->context);
    this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(op->super_LogicalOperator).children,0);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator*(this_01);
    PlanInternal((PhysicalPlanGenerator *)local_120,(LogicalOperator *)(local_120 + 8));
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(this_00);
    auVar1 = local_120;
    local_120 = (undefined1  [8])0x0;
    ::std::__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::reset
              ((__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
               &pPVar2->physical_plan,(pointer)auVar1);
    auVar1 = local_120;
    if (local_120 != (undefined1  [8])0x0) {
      PhysicalPlan::~PhysicalPlan((PhysicalPlan *)local_120);
      operator_delete((void *)auVar1);
    }
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(this_00);
    pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&pPVar2->physical_plan);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar3->root);
    pPVar4 = (pPVar3->root).ptr;
    pPVar2 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(this_00);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pPVar2->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &(pPVar4->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ~PhysicalPlanGenerator((PhysicalPlanGenerator *)(local_120 + 8));
  }
  pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&this->physical_plan);
  pPVar4 = PhysicalPlan::
           Make<duckdb::PhysicalPrepare,std::__cxx11::string&,duckdb::shared_ptr<duckdb::PreparedStatementData,true>,unsigned_long&>
                     (pPVar3,&op->name,this_00,&(op->super_LogicalOperator).estimated_cardinality);
  return pPVar4;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalPrepare &op) {
	// Generate the physical plan only if all parameters are bound.
	// Otherwise, the physical plan is never used.
	D_ASSERT(op.children.size() <= 1);
	if (op.prepared->properties.bound_all_parameters && !op.children.empty()) {
		PhysicalPlanGenerator inner_planner(context);
		op.prepared->physical_plan = inner_planner.PlanInternal(*op.children[0]);
		op.prepared->types = op.prepared->physical_plan->Root().types;
	}
	return Make<PhysicalPrepare>(op.name, std::move(op.prepared), op.estimated_cardinality);
}